

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcd.c
# Opt level: O1

void trn_bcd(mdl_t *mdl)

{
  int *piVar1;
  uint32_t len;
  seq_t **ppsVar2;
  seq_t *psVar3;
  long lVar4;
  uint64_t *puVar5;
  double *pdVar6;
  double *pdVar7;
  char *pcVar8;
  opt_t *poVar9;
  double *pdVar10;
  double *pdVar11;
  bool bVar12;
  mdl_t *pmVar13;
  _Bool _Var14;
  ulong uVar15;
  void *pvVar16;
  void *pvVar17;
  bcd_t *bcd;
  double *pdVar18;
  uint32_t *puVar19;
  grd_st_t *pgVar20;
  ulong uVar21;
  undefined4 uVar22;
  double dVar23;
  uint uVar24;
  uint64_t uVar25;
  double *pdVar26;
  size_t size;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  uint uVar30;
  uint64_t uVar31;
  void *__s;
  uint32_t n;
  ulong uVar32;
  void *pvVar33;
  double dVar34;
  undefined8 uStack_d0;
  double *local_c8;
  ulong local_c0;
  double *local_b8;
  ulong local_b0;
  uint local_a4;
  char *local_a0;
  void *local_98;
  void *local_90;
  double local_88;
  undefined8 uStack_80;
  double *local_70;
  seq_t *local_68;
  bcd_t *local_60;
  uint32_t local_54;
  uint32_t *local_50;
  mdl_t *local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  local_b0 = (ulong)mdl->nlbl;
  uVar31 = mdl->nobs;
  local_40 = (uint64_t)mdl->train->mlen;
  dVar34 = (double)(ulong)mdl->train->nseq;
  local_54 = mdl->opt->maxiter;
  uStack_d0 = 0x105728;
  local_48 = mdl;
  info("    - Build the index\n");
  uStack_d0 = 0x105736;
  info("        1/2 -- scan the sequences\n");
  uVar15 = uVar31 * 4 + 0xf & 0xfffffffffffffff0;
  pvVar33 = (void *)((long)&local_c8 - uVar15);
  __s = (void *)((long)pvVar33 - uVar15);
  local_38 = uVar31;
  if (uVar31 != 0) {
    *(undefined8 *)((long)__s + -8) = 0x105775;
    memset(pvVar33,0,uVar31 * 4);
    *(undefined8 *)((long)__s + -8) = 0x105785;
    memset(__s,0xff,uVar31 * 4);
  }
  uVar31 = local_38;
  if (dVar34 != 0.0) {
    ppsVar2 = local_48->train->seq;
    dVar23 = 0.0;
    do {
      psVar3 = ppsVar2[(long)dVar23];
      uVar27 = psVar3->len;
      if ((ulong)uVar27 != 0) {
        uVar15 = 0;
        do {
          uVar24 = *(uint *)&psVar3[uVar15 * 2 + 1].field_0x4;
          if ((ulong)uVar24 != 0) {
            lVar4 = *(long *)(psVar3 + uVar15 * 2 + 2);
            uVar29 = 0;
            do {
              *(int *)((long)__s + *(long *)(lVar4 + uVar29 * 8) * 4) = SUB84(dVar23,0);
              uVar29 = uVar29 + 1;
            } while (uVar24 != uVar29);
          }
          if (*(int *)&psVar3[uVar15 * 2 + 1].raw != 0) {
            puVar5 = psVar3[uVar15 * 2 + 2].raw;
            uVar24 = *(uint *)&psVar3[uVar15 * 2 + 1].raw;
            uVar29 = 0;
            do {
              *(int *)((long)__s + puVar5[uVar29] * 4) = SUB84(dVar23,0);
              uVar29 = uVar29 + 1;
            } while (uVar29 < uVar24);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar27);
      }
      uVar31 = local_38;
      if (local_38 != 0) {
        uVar25 = 0;
        do {
          piVar1 = (int *)((long)pvVar33 + uVar25 * 4);
          *piVar1 = *piVar1 + (uint)(dVar23 == (double)(ulong)*(uint *)((long)__s + uVar25 * 4));
          uVar25 = uVar25 + 1;
        } while (uVar31 != uVar25);
      }
      dVar23 = (double)((long)dVar23 + 1);
    } while (dVar23 != dVar34);
  }
  local_88 = dVar34;
  local_50 = (uint32_t *)(uVar31 * 4);
  *(undefined8 *)((long)__s + -8) = 0x105852;
  pvVar16 = xmalloc((size_t)(uVar31 * 4));
  *(undefined8 *)((long)__s + -8) = 0x105862;
  local_90 = xmalloc(uVar31 * 8);
  if (uVar31 != 0) {
    uVar31 = 0;
    do {
      uVar27 = *(uint *)((long)pvVar33 + uVar31 * 4);
      *(uint *)((long)pvVar16 + uVar31 * 4) = uVar27;
      *(undefined8 *)((long)__s + -8) = 0x10587e;
      pvVar17 = xmalloc((ulong)uVar27 << 2);
      *(void **)((long)local_90 + uVar31 * 8) = pvVar17;
      uVar31 = uVar31 + 1;
    } while (local_38 != uVar31);
  }
  local_98 = pvVar16;
  *(undefined8 *)((long)__s + -8) = 0x1058a7;
  info("        2/2 -- Populate the index\n");
  puVar19 = local_50;
  if (local_38 != 0) {
    *(undefined8 *)((long)__s + -8) = 0x1058bf;
    memset(pvVar33,0,(size_t)puVar19);
    *(undefined8 *)((long)__s + -8) = 0x1058cf;
    memset(__s,0xff,(size_t)puVar19);
  }
  dVar34 = local_88;
  pvVar16 = local_90;
  if (local_88 != 0.0) {
    ppsVar2 = local_48->train->seq;
    dVar23 = 0.0;
    do {
      psVar3 = ppsVar2[(long)dVar23];
      uVar27 = psVar3->len;
      uVar22 = SUB84(dVar23,0);
      if ((ulong)uVar27 != 0) {
        uVar15 = 0;
        do {
          uVar24 = *(uint *)&psVar3[uVar15 * 2 + 1].field_0x4;
          if ((ulong)uVar24 != 0) {
            lVar4 = *(long *)(psVar3 + uVar15 * 2 + 2);
            uVar29 = 0;
            do {
              *(undefined4 *)((long)__s + *(long *)(lVar4 + uVar29 * 8) * 4) = uVar22;
              uVar29 = uVar29 + 1;
            } while (uVar24 != uVar29);
          }
          if (*(int *)&psVar3[uVar15 * 2 + 1].raw != 0) {
            puVar5 = psVar3[uVar15 * 2 + 2].raw;
            uVar24 = *(uint *)&psVar3[uVar15 * 2 + 1].raw;
            uVar29 = 0;
            do {
              *(undefined4 *)((long)__s + puVar5[uVar29] * 4) = uVar22;
              uVar29 = uVar29 + 1;
            } while (uVar29 < uVar24);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar27);
      }
      uVar31 = local_38;
      if (local_38 != 0) {
        uVar25 = 0;
        do {
          if (dVar23 == (double)(ulong)*(uint *)((long)__s + uVar25 * 4)) {
            lVar4 = *(long *)((long)pvVar16 + uVar25 * 8);
            uVar27 = *(uint *)((long)pvVar33 + uVar25 * 4);
            *(uint *)((long)pvVar33 + uVar25 * 4) = uVar27 + 1;
            *(undefined4 *)(lVar4 + (ulong)uVar27 * 4) = uVar22;
          }
          uVar25 = uVar25 + 1;
        } while (uVar31 != uVar25);
      }
      dVar23 = (double)((long)dVar23 + 1);
    } while (dVar23 != dVar34);
  }
  *(undefined8 *)((long)__s + -8) = 0x1059a4;
  info("      Done\n");
  *(undefined8 *)((long)__s + -8) = 0x1059ae;
  bcd = (bcd_t *)xmalloc(0x38);
  uVar15 = local_b0;
  *(undefined8 *)((long)__s + -8) = 0x1059c0;
  pdVar18 = xvm_new(uVar15);
  bcd->ugrd = pdVar18;
  *(undefined8 *)((long)__s + -8) = 0x1059cc;
  pdVar18 = xvm_new(uVar15);
  bcd->uhes = pdVar18;
  uVar29 = (ulong)(uint)((int)uVar15 * (int)uVar15);
  *(undefined8 *)((long)__s + -8) = 0x1059de;
  pdVar18 = xvm_new(uVar29);
  bcd->bgrd = pdVar18;
  *(undefined8 *)((long)__s + -8) = 0x1059ea;
  pdVar18 = xvm_new(uVar29);
  bcd->bhes = pdVar18;
  size = local_40 << 2;
  *(undefined8 *)((long)__s + -8) = 0x1059fb;
  puVar19 = (uint32_t *)xmalloc(size);
  pmVar13 = local_48;
  bcd->actpos = puVar19;
  *(undefined8 *)((long)__s + -8) = 0x105a0a;
  pgVar20 = grd_stnew(pmVar13,(double *)0x0);
  bcd->grd_st = pgVar20;
  if (local_54 != 0) {
    local_60 = bcd;
    uVar27 = 1;
    do {
      local_a4 = uVar27;
      if (local_38 != 0) {
        uVar31 = 0;
        do {
          if ((int)uVar15 != 0) {
            pdVar18 = bcd->ugrd;
            pdVar6 = bcd->uhes;
            pdVar7 = bcd->bgrd;
            pdVar26 = bcd->bhes;
            uVar29 = 0;
            uVar21 = 0;
            do {
              pdVar18[uVar29] = 0.0;
              pdVar6[uVar29] = 0.0;
              uVar32 = uVar15 & 0xffffffff;
              do {
                pdVar7[uVar21] = 0.0;
                pdVar26[uVar21] = 0.0;
                uVar21 = (ulong)((int)uVar21 + 1);
                uVar27 = (int)uVar32 - 1;
                uVar32 = (ulong)uVar27;
              } while (uVar27 != 0);
              uVar29 = uVar29 + 1;
            } while (uVar29 != uVar15);
          }
          local_40 = uVar31;
          if (*(int *)((long)local_98 + uVar31 * 4) != 0) {
            uVar15 = 0;
            do {
              psVar3 = local_48->train->seq
                       [*(uint *)(*(long *)((long)local_90 + uVar31 * 8) + uVar15 * 4)];
              uVar27 = psVar3->len;
              puVar19 = bcd->actpos;
              if ((ulong)uVar27 == 0) {
                uVar24 = 0;
              }
              else {
                pcVar8 = local_48->kind;
                uVar29 = 0;
                uVar24 = 0;
                do {
                  if ((pcVar8[uVar31] & 1U) == 0) {
                    bVar12 = false;
                  }
                  else {
                    uVar21 = 0;
                    bVar12 = false;
                    do {
                      if (*(uint *)&psVar3[uVar29 * 2 + 1].field_0x4 == uVar21) break;
                      if (*(uint64_t *)(*(long *)(psVar3 + uVar29 * 2 + 2) + uVar21 * 8) == local_40
                         ) {
                        bVar12 = true;
                      }
                      uVar21 = uVar21 + 1;
                    } while (!bVar12);
                  }
                  if (((pcVar8[uVar31] & 2U) != 0) && (!bVar12)) {
                    uVar21 = 0;
                    do {
                      if (*(uint *)&psVar3[uVar29 * 2 + 1].raw == uVar21) break;
                      if (psVar3[uVar29 * 2 + 2].raw[uVar21] == local_40) {
                        bVar12 = true;
                      }
                      uVar21 = uVar21 + 1;
                    } while (!bVar12);
                  }
                  if (bVar12) {
                    uVar21 = (ulong)uVar24;
                    uVar24 = uVar24 + 1;
                    puVar19[uVar21] = (uint32_t)uVar29;
                  }
                  uVar29 = uVar29 + 1;
                  uVar31 = local_40;
                } while (uVar29 != uVar27);
              }
              bcd->actcnt = uVar24;
              pgVar20 = bcd->grd_st;
              pgVar20->first = *puVar19;
              pgVar20->last = puVar19[uVar24 - 1];
              len = psVar3->len;
              local_c0 = uVar15;
              local_68 = psVar3;
              *(undefined8 *)((long)__s + -8) = 0x105bb2;
              grd_stcheck(pgVar20,len);
              pmVar13 = local_48;
              pgVar20 = bcd->grd_st;
              if (local_48->opt->sparse == true) {
                *(undefined8 *)((long)__s + -8) = 0x105bcb;
                grd_spdopsi(pgVar20,psVar3);
                pgVar20 = bcd->grd_st;
                *(undefined8 *)((long)__s + -8) = 0x105bd7;
                grd_spfwdbwd(pgVar20,psVar3);
                *(undefined8 *)((long)__s + -8) = 0x105be8;
                bcd_spgradhes(pmVar13,bcd,psVar3,uVar31);
              }
              else {
                *(undefined8 *)((long)__s + -8) = 0x105bfd;
                grd_fldopsi(pgVar20,psVar3);
                pgVar20 = bcd->grd_st;
                *(undefined8 *)((long)__s + -8) = 0x105c09;
                grd_flfwdbwd(pgVar20,psVar3);
                pgVar20 = bcd->grd_st;
                uVar27 = pmVar13->nlbl;
                uVar15 = (ulong)uVar27;
                local_c8 = pgVar20->psi;
                local_70 = pgVar20->alpha;
                local_b8 = pgVar20->beta;
                pdVar18 = pgVar20->bnorm;
                local_50 = bcd->actpos;
                uVar24 = bcd->actcnt;
                local_88 = (double)(ulong)uVar24;
                pdVar6 = bcd->bgrd;
                pdVar7 = bcd->bhes;
                local_a0 = pmVar13->kind;
                if ((uVar24 != 0 & local_a0[uVar31]) == 1) {
                  pdVar26 = pgVar20->unorm;
                  pdVar10 = local_60->ugrd;
                  pdVar11 = local_60->uhes;
                  dVar34 = 0.0;
                  do {
                    uVar29 = (ulong)local_50[(long)dVar34];
                    if (uVar27 != 0) {
                      uVar21 = 0;
                      do {
                        dVar23 = local_70[uVar29 * uVar15 + uVar21] *
                                 local_b8[uVar29 * uVar15 + uVar21] * pdVar26[uVar29];
                        pdVar10[uVar21] = pdVar10[uVar21] + dVar23;
                        pdVar11[uVar21] = (1.0 - dVar23) * dVar23 + pdVar11[uVar21];
                        uVar21 = uVar21 + 1;
                      } while (uVar15 != uVar21);
                    }
                    pdVar10[local_68[uVar29 * 2 + 1].len] =
                         pdVar10[local_68[uVar29 * 2 + 1].len] + -1.0;
                    dVar34 = (double)((long)dVar34 + 1);
                  } while (dVar34 != local_88);
                }
                uVar31 = local_40;
                if (((local_a0[local_40] & 2U) != 0) && (uVar24 != 0)) {
                  local_a0 = (char *)(uVar15 * uVar15);
                  local_68 = local_68 + 1;
                  dVar34 = 0.0;
                  do {
                    uVar24 = local_50[(long)dVar34];
                    uVar29 = (ulong)uVar24;
                    if (uVar29 != 0) {
                      if (uVar15 != 0) {
                        pdVar26 = local_c8 + (long)local_a0 * uVar29;
                        uVar21 = 0;
                        iVar28 = 0;
                        do {
                          uVar32 = 0;
                          do {
                            uVar30 = iVar28 + (int)uVar32;
                            dVar23 = local_70[(uVar24 - 1) * uVar15 + uVar21] *
                                     local_b8[uVar29 * uVar15 + uVar32] * pdVar26[uVar32] *
                                     pdVar18[uVar29];
                            pdVar6[uVar30] = pdVar6[uVar30] + dVar23;
                            pdVar7[uVar30] = (1.0 - dVar23) * dVar23 + pdVar7[uVar30];
                            uVar32 = uVar32 + 1;
                          } while (uVar15 != uVar32);
                          uVar21 = uVar21 + 1;
                          pdVar26 = pdVar26 + uVar15;
                          iVar28 = iVar28 + (int)uVar32;
                        } while (uVar21 != uVar15);
                      }
                      uVar24 = local_68[(ulong)(uVar24 - 1) * 2].len * uVar27 +
                               local_68[uVar29 * 2].len;
                      pdVar6[uVar24] = pdVar6[uVar24] + -1.0;
                    }
                    dVar34 = (double)((long)dVar34 + 1);
                  } while (dVar34 != local_88);
                }
              }
              uVar15 = local_c0 + 1;
              bcd = local_60;
            } while (uVar15 < *(uint *)((long)local_98 + uVar31 * 4));
          }
          poVar9 = local_48->opt;
          local_88 = poVar9->rho1;
          local_50 = (uint32_t *)poVar9->rho2;
          pdVar18 = (double *)(poVar9->bcd).kappa;
          uVar27 = local_48->nlbl;
          uVar15 = (ulong)uVar27;
          pdVar6 = bcd->bgrd;
          pdVar7 = bcd->bhes;
          uStack_80 = 0;
          if ((local_48->kind[uVar31] & 1U) != 0) {
            pdVar26 = local_60->ugrd;
            pdVar10 = local_60->uhes;
            dVar34 = 1.0;
            if (uVar15 != 0) {
              uVar29 = 0;
              dVar23 = 1.0;
              do {
                dVar34 = ABS(pdVar26[uVar29] / pdVar10[uVar29]);
                if (dVar34 <= dVar23) {
                  dVar34 = dVar23;
                }
                uVar29 = uVar29 + 1;
                dVar23 = dVar34;
              } while (uVar15 != uVar29);
            }
            local_70 = pdVar18;
            *(undefined8 *)((long)__s + -8) = 0x105f16;
            xvm_scale(pdVar10,pdVar10,dVar34 * (double)pdVar18,uVar15);
            pdVar18 = local_70;
            if (uVar15 != 0) {
              uVar31 = local_48->uoff[local_40];
              pdVar11 = local_48->theta;
              uVar29 = 0;
              do {
                dVar34 = pdVar11[uVar31 + uVar29] * pdVar10[uVar29] - pdVar26[uVar29];
                if (dVar34 <= local_88) {
                  dVar23 = 0.0;
                  if (dVar34 < -local_88) {
                    dVar23 = dVar34 + local_88;
                  }
                }
                else {
                  dVar23 = dVar34 - local_88;
                }
                pdVar11[uVar31 + uVar29] = dVar23 / (pdVar10[uVar29] + (double)local_50);
                uVar29 = uVar29 + 1;
              } while (uVar15 != uVar29);
            }
          }
          uVar15 = local_b0;
          if ((local_48->kind[local_40] & 2U) != 0) {
            uVar27 = uVar27 * uVar27;
            uVar29 = (ulong)uVar27;
            dVar34 = 1.0;
            if (uVar27 != 0) {
              uVar21 = 0;
              dVar23 = 1.0;
              do {
                dVar34 = ABS(pdVar6[uVar21] / pdVar7[uVar21]);
                if (dVar34 <= dVar23) {
                  dVar34 = dVar23;
                }
                uVar21 = uVar21 + 1;
                dVar23 = dVar34;
              } while (uVar29 != uVar21);
            }
            *(undefined8 *)((long)__s + -8) = 0x106021;
            xvm_scale(pdVar7,pdVar7,(double)pdVar18 * dVar34,uVar29);
            if (uVar27 != 0) {
              uVar31 = local_48->boff[local_40];
              pdVar18 = local_48->theta;
              uVar21 = 0;
              do {
                dVar34 = pdVar18[uVar31 + uVar21] * pdVar7[uVar21] - pdVar6[uVar21];
                if (dVar34 <= local_88) {
                  dVar23 = 0.0;
                  if (dVar34 < -local_88) {
                    dVar23 = dVar34 + local_88;
                  }
                }
                else {
                  dVar23 = dVar34 - local_88;
                }
                pdVar18[uVar31 + uVar21] = dVar23 / (pdVar7[uVar21] + (double)local_50);
                uVar21 = uVar21 + 1;
              } while (uVar29 != uVar21);
            }
          }
          uVar31 = local_40 + 1;
          bcd = local_60;
        } while (uVar31 != local_38);
      }
      pmVar13 = local_48;
      uVar27 = local_a4;
      *(undefined8 *)((long)__s + -8) = 0x1060de;
      _Var14 = uit_progress(pmVar13,uVar27,-1.0);
    } while ((_Var14) && (uVar27 = uVar27 + 1, uVar27 <= local_54));
  }
  pgVar20 = bcd->grd_st;
  *(undefined8 *)((long)__s + -8) = 0x106109;
  grd_stfree(pgVar20);
  pdVar18 = bcd->ugrd;
  *(undefined8 *)((long)__s + -8) = 0x106112;
  xvm_free(pdVar18);
  pdVar18 = bcd->uhes;
  *(undefined8 *)((long)__s + -8) = 0x10611b;
  xvm_free(pdVar18);
  pdVar18 = bcd->bgrd;
  *(undefined8 *)((long)__s + -8) = 0x106124;
  xvm_free(pdVar18);
  pdVar18 = bcd->bhes;
  *(undefined8 *)((long)__s + -8) = 0x10612d;
  xvm_free(pdVar18);
  puVar19 = bcd->actpos;
  *(undefined8 *)((long)__s + -8) = 0x106136;
  free(puVar19);
  *(undefined8 *)((long)__s + -8) = 0x10613e;
  free(bcd);
  pvVar33 = local_90;
  if (local_38 != 0) {
    uVar31 = 0;
    do {
      pvVar16 = *(void **)((long)pvVar33 + uVar31 * 8);
      *(undefined8 *)((long)__s + -8) = 0x106157;
      free(pvVar16);
      uVar31 = uVar31 + 1;
    } while (local_38 != uVar31);
  }
  *(undefined8 *)((long)__s + -8) = 0x106168;
  free(pvVar33);
  free(local_98);
  return;
}

Assistant:

void trn_bcd(mdl_t *mdl) {
	const uint32_t Y = mdl->nlbl;
	const uint64_t O = mdl->nobs;
	const uint32_t S = mdl->train->nseq;
	const uint32_t T = mdl->train->mlen;
	const uint32_t K = mdl->opt->maxiter;
	// Build the index:
	//   Count active sequences per blocks
	info("    - Build the index\n");
	info("        1/2 -- scan the sequences\n");
	uint64_t tot = 0;
	uint32_t cnt[O], lcl[O];
	for (uint64_t o = 0; o < O; o++)
		cnt[o] = 0, lcl[o] = (uint32_t)-1;
	for (uint32_t s = 0; s < S; s++) {
		// List actives blocks
		const seq_t *seq = mdl->train->seq[s];
		for (uint32_t t = 0; t < seq->len; t++) {
			for (uint32_t b = 0; b < seq->pos[t].ucnt; b++)
				lcl[seq->pos[t].uobs[b]] = s;
			for (uint32_t b = 0; b < seq->pos[t].bcnt; b++)
				lcl[seq->pos[t].bobs[b]] = s;
		}
		// Updates blocks count
		for (uint64_t o = 0; o < O; o++)
			cnt[o] += (lcl[o] == s);
	}
	for (uint64_t o = 0; o < O; o++)
		tot += cnt[o];
	// Allocate memory
	uint32_t  *idx_cnt = xmalloc(sizeof(uint32_t  ) * O);
	uint32_t **idx_lst = xmalloc(sizeof(uint32_t *) * O);
	for (uint64_t o = 0; o < O; o++) {
		idx_cnt[o] = cnt[o];
		idx_lst[o] = xmalloc(sizeof(uint32_t) * cnt[o]);
	}
	// Populate the index
	info("        2/2 -- Populate the index\n");
	for (uint64_t o = 0; o < O; o++)
		cnt[o] = 0, lcl[o] = (uint32_t)-1;
	for (uint32_t s = 0; s < S; s++) {
		// List actives blocks
		const seq_t *seq = mdl->train->seq[s];
		for (uint32_t t = 0; t < seq->len; t++) {
			for (uint32_t b = 0; b < seq->pos[t].ucnt; b++)
				lcl[seq->pos[t].uobs[b]] = s;
			for (uint32_t b = 0; b < seq->pos[t].bcnt; b++)
				lcl[seq->pos[t].bobs[b]] = s;
		}
		// Build index
		for (uint64_t o = 0; o < O; o++)
			if (lcl[o] == s)
				idx_lst[o][cnt[o]++] = s;
	}
	info("      Done\n");
	// Allocate the specific trainer of BCD
	bcd_t *bcd = xmalloc(sizeof(bcd_t));
	bcd->ugrd   = xvm_new(Y);
	bcd->uhes   = xvm_new(Y);
	bcd->bgrd   = xvm_new(Y * Y);
	bcd->bhes   = xvm_new(Y * Y);
	bcd->actpos = xmalloc(sizeof(int) * T);
	bcd->grd_st = grd_stnew(mdl, NULL);
	// And train the model
	for (uint32_t i = 1; i <= K; i++) {
		for (uint64_t o = 0; o < O; o++) {
			// Clear the gradient and the hessian
			for (uint32_t y = 0, d = 0; y < Y; y++) {
				bcd->ugrd[y] = 0.0;
				bcd->uhes[y] = 0.0;
				for (uint32_t yp = 0; yp < Y; yp++, d++) {
					bcd->bgrd[d] = 0.0;
					bcd->bhes[d] = 0.0;
				}
			}
			// Process active sequences
			for (uint32_t s = 0; s < idx_cnt[o]; s++) {
				const uint32_t id = idx_lst[o][s];
				const seq_t *seq = mdl->train->seq[id];
				bcd_actpos(mdl, bcd, seq, o);
				grd_stcheck(bcd->grd_st, seq->len);
				if (mdl->opt->sparse) {
					grd_spdopsi(bcd->grd_st, seq);
					grd_spfwdbwd(bcd->grd_st, seq);
					bcd_spgradhes(mdl, bcd, seq, o);
				} else {
					grd_fldopsi(bcd->grd_st, seq);
					grd_flfwdbwd(bcd->grd_st, seq);
					bcd_flgradhes(mdl, bcd, seq, o);
				}
			}
			// And update the model
			bcd_update(mdl, bcd, o);
		}
		if (!uit_progress(mdl, i, -1.0))
			break;
	}
	// Cleanup memory
	grd_stfree(bcd->grd_st);
	xvm_free(bcd->ugrd); xvm_free(bcd->uhes);
	xvm_free(bcd->bgrd); xvm_free(bcd->bhes);
	free(bcd->actpos);
	free(bcd);
	for (uint64_t o = 0; o < O; o++)
		free(idx_lst[o]);
	free(idx_lst);
	free(idx_cnt);
}